

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathRegisterNs(xmlXPathContextPtr ctxt,xmlChar *prefix,xmlChar *ns_uri)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  xmlChar *userdata;
  
  if ((prefix != (xmlChar *)0x0 && ctxt != (xmlXPathContextPtr)0x0) && (*prefix != '\0')) {
    if (ctxt->nsHash == (xmlHashTablePtr)0x0) {
      pxVar2 = xmlHashCreate(10);
      ctxt->nsHash = pxVar2;
    }
    pxVar2 = ctxt->nsHash;
    if (pxVar2 != (xmlHashTablePtr)0x0) {
      if (ns_uri != (xmlChar *)0x0) {
        userdata = xmlStrdup(ns_uri);
        iVar1 = xmlHashUpdateEntry(pxVar2,prefix,userdata,xmlHashDefaultDeallocator);
        return iVar1;
      }
      iVar1 = xmlHashRemoveEntry(pxVar2,prefix,xmlHashDefaultDeallocator);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlXPathRegisterNs(xmlXPathContextPtr ctxt, const xmlChar *prefix,
			   const xmlChar *ns_uri) {
    if (ctxt == NULL)
	return(-1);
    if (prefix == NULL)
	return(-1);
    if (prefix[0] == 0)
	return(-1);

    if (ctxt->nsHash == NULL)
	ctxt->nsHash = xmlHashCreate(10);
    if (ctxt->nsHash == NULL)
	return(-1);
    if (ns_uri == NULL)
        return(xmlHashRemoveEntry(ctxt->nsHash, prefix,
	                          xmlHashDefaultDeallocator));
    return(xmlHashUpdateEntry(ctxt->nsHash, prefix, (void *) xmlStrdup(ns_uri),
			      xmlHashDefaultDeallocator));
}